

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PPointer::SetOps(PPointer *this)

{
  BYTE BVar1;
  bool local_11;
  PPointer *this_local;
  
  (this->super_PBasicType).super_PType.storeOp = '1';
  local_11 = false;
  if (this->PointedType != (PType *)0x0) {
    local_11 = DObject::IsKindOf((DObject *)this->PointedType,PClass::RegistrationInfo.MyClass);
  }
  BVar1 = '\x1e';
  if (local_11 != false) {
    BVar1 = '\x1c';
  }
  (this->super_PBasicType).super_PType.loadOp = BVar1;
  (this->super_PBasicType).super_PType.moveOp = ';';
  (this->super_PBasicType).super_PType.RegType = '\x03';
  return;
}

Assistant:

void PPointer::SetOps()
{
	storeOp = OP_SP;
	loadOp = (PointedType && PointedType->IsKindOf(RUNTIME_CLASS(PClass))) ? OP_LO : OP_LP;
	moveOp = OP_MOVEA;
	RegType = REGT_POINTER;
}